

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

LaneArray<2> * __thiscall
wasm::Literal::getLanesI64x2(LaneArray<2> *__return_storage_ptr__,Literal *this)

{
  Literal *other;
  byte *pbVar1;
  reference this_00;
  size_type __n;
  size_type sVar2;
  size_type __n_00;
  long lVar3;
  ulong uVar4;
  undefined1 local_68 [8];
  array<unsigned_char,_16UL> bytes;
  
  if ((this->type).id == 6) {
    _local_68 = getv128(this);
    __return_storage_ptr__->_M_elems[0].field_0.i64 = 0;
    __return_storage_ptr__->_M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
    __return_storage_ptr__->_M_elems[0].type.id = 0;
    __return_storage_ptr__->_M_elems[1].field_0.i64 = 0;
    __return_storage_ptr__->_M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
    __return_storage_ptr__->_M_elems[1].type.id = 0;
    sVar2 = 0;
    for (__n_00 = 0; __n_00 != 2; __n_00 = __n_00 + 1) {
      uVar4 = 0;
      __n = sVar2;
      for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 8) {
        pbVar1 = std::array<unsigned_char,_16UL>::at((array<unsigned_char,_16UL> *)local_68,__n);
        uVar4 = uVar4 | (ulong)*pbVar1 << ((byte)lVar3 & 0x3f);
        __n = __n + 1;
      }
      bytes._M_elems._8_8_ = uVar4;
      this_00 = std::array<wasm::Literal,_2UL>::at(__return_storage_ptr__,__n_00);
      other = (Literal *)(bytes._M_elems + 8);
      if (this_00 != other) {
        ~Literal(this_00);
        Literal(this_00,other);
      }
      ~Literal(other);
      sVar2 = sVar2 + 8;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Type::v128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x647,"LaneArray<Lanes> wasm::getLanes(const Literal &) [LaneT = long, Lanes = 2]")
  ;
}

Assistant:

LaneArray<2> Literal::getLanesI64x2() const {
  return getLanes<int64_t, 2>(*this);
}